

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kinematics.cc
# Opt level: O3

uint __thiscall
RigidBodyDynamics::InverseKinematicsConstraintSet::AddOrientationConstraint
          (InverseKinematicsConstraintSet *this,uint body_id,Matrix3d *target_orientation,
          float weight)

{
  pointer *ppVVar1;
  pointer *ppMVar2;
  iterator __position;
  iterator iVar3;
  iterator iVar4;
  iterator __position_00;
  long lVar5;
  iterator __position_01;
  byte bVar6;
  float local_40;
  uint local_3c;
  Vector3_t local_38;
  
  bVar6 = 0;
  local_38.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] =
       (double)CONCAT44(local_38.super_Vector3d.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[0]._4_4_,1);
  __position._M_current =
       (this->constraint_type).
       super__Vector_base<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_40 = weight;
  local_3c = body_id;
  if (__position._M_current ==
      (this->constraint_type).
      super__Vector_base<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
    ::_M_realloc_insert<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>
              (&this->constraint_type,__position,(ConstraintType *)&local_38);
  }
  else {
    *__position._M_current = ConstraintTypeOrientation;
    (this->constraint_type).
    super__Vector_base<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
    ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  iVar3._M_current =
       (this->body_ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->body_ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->body_ids,iVar3,&local_3c)
    ;
  }
  else {
    *iVar3._M_current = body_id;
    (this->body_ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  local_38.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  local_38.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[1] = 0.0;
  local_38.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[2] = 0.0;
  iVar4._M_current =
       (this->body_points).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (this->body_points).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Vector3_t,_std::allocator<Vector3_t>_>::_M_realloc_insert<Vector3_t>
              (&this->body_points,iVar4,&local_38);
  }
  else {
    ((iVar4._M_current)->super_Vector3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 0.0;
    ((iVar4._M_current)->super_Vector3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] = 0.0;
    ((iVar4._M_current)->super_Vector3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] = 0.0;
    ppVVar1 = &(this->body_points).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl
               .super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  local_38.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  local_38.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[1] = 0.0;
  local_38.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[2] = 0.0;
  iVar4._M_current =
       (this->target_positions).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (this->target_positions).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Vector3_t,_std::allocator<Vector3_t>_>::_M_realloc_insert<Vector3_t>
              (&this->target_positions,iVar4,&local_38);
  }
  else {
    ((iVar4._M_current)->super_Vector3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 0.0;
    ((iVar4._M_current)->super_Vector3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] = 0.0;
    ((iVar4._M_current)->super_Vector3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] = 0.0;
    ppVVar1 = &(this->target_positions).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  __position_01._M_current =
       (this->target_orientations).super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (__position_01._M_current ==
      (this->target_orientations).super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Matrix3_t,std::allocator<Matrix3_t>>::_M_realloc_insert<Matrix3_t_const&>
              ((vector<Matrix3_t,std::allocator<Matrix3_t>> *)&this->target_orientations,
               __position_01,target_orientation);
  }
  else {
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      ((__position_01._M_current)->super_Matrix3d).
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
           (target_orientation->super_Matrix3d).
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0];
      target_orientation = (Matrix3d *)((long)target_orientation + ((ulong)bVar6 * -2 + 1) * 8);
      __position_01._M_current =
           (Matrix3_t *)((long)__position_01._M_current + ((ulong)bVar6 * -2 + 1) * 8);
    }
    ppMVar2 = &(this->target_orientations).super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar2 = *ppMVar2 + 1;
  }
  iVar3._M_current =
       (this->constraint_row_index).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->constraint_row_index).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->constraint_row_index,
               iVar3,&this->num_constraints);
  }
  else {
    *iVar3._M_current = this->num_constraints;
    (this->constraint_row_index).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  __position_00._M_current =
       (this->constraint_weight).super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->constraint_weight).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
              ((vector<float,std::allocator<float>> *)&this->constraint_weight,__position_00,
               &local_40);
  }
  else {
    *__position_00._M_current = weight;
    (this->constraint_weight).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = __position_00._M_current + 1;
  }
  this->num_constraints = this->num_constraints + 3;
  return (int)((ulong)((long)(this->constraint_type).
                             super__Vector_base<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->constraint_type).
                            super__Vector_base<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 2) - 1;
}

Assistant:

RBDL_DLLAPI
unsigned int InverseKinematicsConstraintSet::AddOrientationConstraint(
    unsigned int body_id,
    const Matrix3d& target_orientation,
    float weight
    ) {
  constraint_type.push_back (ConstraintTypeOrientation);
  body_ids.push_back(body_id);
  body_points.push_back(Vector3d::Zero());
  target_positions.push_back(Vector3d::Zero());
  target_orientations.push_back(target_orientation);
  constraint_row_index.push_back(num_constraints);
  constraint_weight.push_back(weight);
  num_constraints = num_constraints + 3;
  return constraint_type.size() - 1;
}